

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O0

lzma_ret lzma2_decoder_init(lzma_lz_decoder *lz,lzma_allocator *allocator,void *opt,
                           lzma_lz_options *lz_options)

{
  lzma_ret lVar1;
  code *__dest;
  undefined1 local_71;
  lzma_options_lzma *options;
  _func_void_ptr_void_ptr_size_t_size_t *local_38;
  lzma_lzma2_coder *coder;
  lzma_lz_options *lz_options_local;
  void *opt_local;
  lzma_allocator *allocator_local;
  lzma_lz_decoder *lz_local;
  
  local_38 = (_func_void_ptr_void_ptr_size_t_size_t *)lz->coder;
  coder = (lzma_lzma2_coder *)lz_options;
  lz_options_local = (lzma_lz_options *)opt;
  opt_local = allocator;
  allocator_local = (lzma_allocator *)lz;
  if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
    local_38 = (_func_void_ptr_void_ptr_size_t_size_t *)lzma_alloc(0xb8,allocator);
    if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = local_38;
    allocator_local->free = lzma2_decode;
    allocator_local[1].free = lzma2_decoder_end;
    __dest = local_38 + 8;
    memset(&options,0,0x28);
    memcpy(__dest,&options,0x28);
  }
  *(undefined4 *)local_38 = 0;
  local_38[0x40] = (code)0x1;
  local_71 = (code)0x1;
  if (lz_options_local->preset_dict != (uint8_t *)0x0) {
    local_71 = (code)((int)lz_options_local->preset_dict_size == 0);
  }
  local_38[0x41] = local_71;
  lVar1 = lzma_lzma_decoder_create
                    ((lzma_lz_decoder *)(local_38 + 8),(lzma_allocator *)opt_local,lz_options_local,
                     (lzma_lz_options *)coder);
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_decoder_init(lzma_lz_decoder *lz, const lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	lzma_lzma2_coder *coder = lz->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_lzma2_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		lz->coder = coder;
		lz->code = &lzma2_decode;
		lz->end = &lzma2_decoder_end;

		coder->lzma = LZMA_LZ_DECODER_INIT;
	}

	const lzma_options_lzma *options = opt;

	coder->sequence = SEQ_CONTROL;
	coder->need_properties = true;
	coder->need_dictionary_reset = options->preset_dict == NULL
			|| options->preset_dict_size == 0;

	return lzma_lzma_decoder_create(&coder->lzma,
			allocator, options, lz_options);
}